

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O3

void __thiscall
vkt::sr::anon_unknown_0::TextureGatherInstance::setupDefaultInputs(TextureGatherInstance *this)

{
  long lVar1;
  deUint32 sizePerElement;
  VkFormat format;
  bool bVar2;
  vector<float,_std::allocator<float>_> texCoord;
  float normalizedCoord [8];
  float position [8];
  void *local_70;
  long local_68;
  long local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0xbf8000003f800000;
  uStack_20 = 0x3f8000003f800000;
  local_38 = 0xbf800000bf800000;
  uStack_30 = 0x3f800000bf800000;
  local_48 = 0x3f800000;
  uStack_40 = 0x3f8000003f800000;
  local_58 = 0;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0x3f800000;
  (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[10])
            (&local_70,this,(ulong)(uint)this->m_currentIteration);
  bVar2 = true;
  if ((this->m_baseParams).gatherType != GATHERTYPE_OFFSET_DYNAMIC) {
    bVar2 = ((this->m_baseParams).textureFormat.order - D & 0xfffffffd) == 0;
  }
  ShaderRenderCaseInstance::addAttribute
            (&this->super_ShaderRenderCaseInstance,0,VK_FORMAT_R32G32_SFLOAT,8,4,&local_38);
  lVar1 = local_68 - (long)local_70 >> 2;
  if (lVar1 == 0xc) {
    sizePerElement = 0xc;
    format = VK_FORMAT_R32G32B32_SFLOAT;
  }
  else {
    if (lVar1 != 8) goto LAB_0061b6c6;
    sizePerElement = 8;
    format = VK_FORMAT_R32G32_SFLOAT;
  }
  ShaderRenderCaseInstance::addAttribute
            (&this->super_ShaderRenderCaseInstance,1,format,sizePerElement,4,local_70);
LAB_0061b6c6:
  if (bVar2) {
    ShaderRenderCaseInstance::addAttribute
              (&this->super_ShaderRenderCaseInstance,2,VK_FORMAT_R32G32_SFLOAT,8,4,&local_58);
  }
  if (local_70 != (void *)0x0) {
    operator_delete(local_70,local_60 - (long)local_70);
  }
  return;
}

Assistant:

void TextureGatherInstance::setupDefaultInputs (void)
{
	const int				numVertices						= 4;
	const float				position[4*2]					=
	{
		-1.0f, -1.0f,
		-1.0f, +1.0f,
		+1.0f, -1.0f,
		+1.0f, +1.0f,
	};
	const float				normalizedCoord[4*2]			=
	{
		0.0f, 0.0f,
		0.0f, 1.0f,
		1.0f, 0.0f,
		1.0f, 1.0f,
	};
	const vector<float>		texCoord						= computeQuadTexCoord(m_currentIteration);
	const bool				needNormalizedCoordInShader		= m_baseParams.gatherType == GATHERTYPE_OFFSET_DYNAMIC || isDepthFormat(m_baseParams.textureFormat);

	addAttribute(0u, vk::VK_FORMAT_R32G32_SFLOAT, 2 * (deUint32)sizeof(float), numVertices, position);

	if (texCoord.size() == 2*4)
		addAttribute(1u, vk::VK_FORMAT_R32G32_SFLOAT, 2 * (deUint32)sizeof(float), numVertices, texCoord.data());
	else if (texCoord.size() == 3*4)
		addAttribute(1u, vk::VK_FORMAT_R32G32B32_SFLOAT, 3 * (deUint32)sizeof(float), numVertices, texCoord.data());
	else
		DE_ASSERT(false);

	if (needNormalizedCoordInShader)
		addAttribute(2u, vk::VK_FORMAT_R32G32_SFLOAT, 2 * (deUint32)sizeof(float), numVertices, normalizedCoord);
}